

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_structs.c
# Opt level: O0

void internal_exr_destroy_part(exr_context_t ctxt,exr_priv_part_t cur)

{
  exr_memory_free_func_t p_Var1;
  exr_attribute_t **ppeVar2;
  exr_attribute_list_t *in_RSI;
  exr_context_t in_RDI;
  uint64_t *ctable;
  exr_memory_free_func_t dofree;
  
  p_Var1 = in_RDI->free_fn;
  exr_attr_list_destroy(in_RDI,in_RSI);
  if (in_RSI[8].entries != (exr_attribute_t **)0x0) {
    (*p_Var1)(in_RSI[8].entries);
  }
  ppeVar2 = in_RSI[10].sorted_entries;
  LOCK();
  in_RSI[10].sorted_entries = (exr_attribute_t **)0x0;
  UNLOCK();
  if ((ppeVar2 != (exr_attribute_t **)0x0) && (ppeVar2 != (exr_attribute_t **)0xffffffffffffffff)) {
    (*p_Var1)(ppeVar2);
  }
  return;
}

Assistant:

static void
internal_exr_destroy_part (exr_context_t ctxt, exr_priv_part_t cur)
{
    exr_memory_free_func_t dofree = ctxt->free_fn;
    uint64_t*              ctable;

    exr_attr_list_destroy ((exr_context_t) ctxt, &(cur->attributes));

    /* we stack x and y together so only have to free the first */
    if (cur->tile_level_tile_count_x) dofree (cur->tile_level_tile_count_x);

#if defined(_MSC_VER)
    ctable = (uint64_t*) InterlockedOr64 (
        (int64_t volatile*) &(cur->chunk_table), 0);
    cur->chunk_table = 0;
#else
    ctable = (uint64_t*) atomic_load (&(cur->chunk_table));
    atomic_store (&(cur->chunk_table), (uintptr_t) (0));
#endif
    if (ctable && ((uintptr_t) ctable) != UINTPTR_MAX) dofree (ctable);
}